

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbmstream_rawclient.cpp
# Opt level: O1

void streamMetaInformationCb(StreamClient *stream,string *method,Value *params)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  UInt UVar4;
  ostream *poVar5;
  long *plVar6;
  Value *pVVar7;
  size_t in_RCX;
  undefined1 auVar8 [8];
  const_iterator cVar9;
  signalReferences_t signalReferences;
  undefined1 local_98 [8];
  _Alloc_hider _Stack_90;
  pointer local_88 [2];
  undefined1 local_78 [16];
  _Rb_tree_node_base local_68;
  StreamClient *local_48;
  ValueIteratorBase local_40;
  
  iVar3 = std::__cxx11::string::compare((char *)method);
  if (iVar3 == 0) {
    local_48 = stream;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The following signal(s) are available : ",0x28);
    local_98 = (undefined1  [8])0x0;
    _Stack_90._M_p = (pointer)0x0;
    local_88[0] = (pointer)0x0;
    cVar9 = Json::Value::begin(params);
    local_40.current_ = cVar9.super_ValueIteratorBase.current_._M_node;
    local_40.isNull_ = cVar9.super_ValueIteratorBase.isNull_;
    while( true ) {
      cVar9 = Json::Value::end(params);
      local_78._0_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
      local_78[8] = cVar9.super_ValueIteratorBase.isNull_;
      bVar2 = Json::ValueIteratorBase::isEqual(&local_40,(SelfType *)local_78);
      if (bVar2) break;
      pVVar7 = Json::ValueIteratorBase::deref(&local_40);
      Json::Value::asString_abi_cxx11_((string *)local_78,pVVar7);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_78._0_8_,
                          CONCAT71(local_78._9_7_,local_78[8]));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      if ((_Rb_tree_node_base *)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_);
      }
      Json::Value::asString_abi_cxx11_((string *)local_78,pVVar7);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_98,
                 (string *)local_78);
      if ((_Rb_tree_node_base *)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_);
      }
      Json::ValueIteratorBase::increment(&local_40);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    plVar6 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    hbm::streaming::StreamClient::subscribe(local_48,(signalReferences_t *)local_98);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The following ",0xe);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," signal(s) were subscribed: ",0x1c);
    auVar8 = local_98;
    if (local_98 != (undefined1  [8])_Stack_90._M_p) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)*(_func_int **)auVar8,
                            (long)((_Base_ptr)auVar8)->_M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' ",2);
        auVar8 = (undefined1  [8])((long)auVar8 + 0x20);
      } while (auVar8 != (undefined1  [8])_Stack_90._M_p);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    plVar6 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)method);
    if (iVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"The following signal(s) are not available anyore: ",0x32);
      cVar9 = Json::Value::begin(params);
      local_98 = (undefined1  [8])cVar9.super_ValueIteratorBase.current_._M_node;
      _Stack_90._M_p._0_1_ = cVar9.super_ValueIteratorBase.isNull_;
      cVar9 = Json::Value::end(params);
      local_78._0_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
      local_78[8] = cVar9.super_ValueIteratorBase.isNull_;
      bVar2 = Json::ValueIteratorBase::isEqual((ValueIteratorBase *)local_98,(SelfType *)local_78);
      if (!bVar2) {
        do {
          pVVar7 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_98);
          Json::Value::asString_abi_cxx11_((string *)local_78,pVVar7);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_78._0_8_,
                              CONCAT71(local_78._9_7_,local_78[8]));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          if ((_Rb_tree_node_base *)local_78._0_8_ != &local_68) {
            operator_delete((void *)local_78._0_8_);
          }
          Json::ValueIteratorBase::increment((ValueIteratorBase *)local_98);
          cVar9 = Json::Value::end(params);
          local_78._0_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
          local_78[8] = cVar9.super_ValueIteratorBase.isNull_;
          bVar2 = Json::ValueIteratorBase::isEqual
                            ((ValueIteratorBase *)local_98,(SelfType *)local_78);
        } while (!bVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      std::ostream::put('8');
      plVar6 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)method);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)method);
        if (iVar3 == 0) {
          bVar2 = Json::Value::empty(params);
          if (!bVar2) {
            pVVar7 = Json::Value::operator[](params,0);
            UVar4 = Json::Value::asUInt(pVVar7);
            if (0x19 < UVar4) {
              pcVar1 = (stream->m_address)._M_dataplus._M_p;
              local_78._0_8_ = &local_68;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_78,pcVar1,pcVar1 + (stream->m_address)._M_string_length);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_78._0_8_,
                                  CONCAT71(local_78._9_7_,local_78[8]));
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,": ring buffer fill level is ",0x1c);
              pVVar7 = Json::Value::operator[](params,0);
              Json::Value::asUInt(pVVar7);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"%",1);
              std::endl<char,std::char_traits<char>>(poVar5);
              if ((_Rb_tree_node_base *)local_78._0_8_ != &local_68) {
                operator_delete((void *)local_78._0_8_);
              }
            }
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Meta information: ",0x12);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(method->_M_dataplus)._M_p,
                              method->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          Json::FastWriter::FastWriter((FastWriter *)local_78);
          Json::FastWriter::write_abi_cxx11_
                    ((FastWriter *)local_98,(int)(FastWriter *)local_78,params,in_RCX);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_98,(long)_Stack_90._M_p);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          if (local_98 != (undefined1  [8])local_88) {
            operator_delete((void *)local_98);
          }
          Json::FastWriter::~FastWriter((FastWriter *)local_78);
        }
      }
    }
  }
  return;
}

Assistant:

static void streamMetaInformationCb(hbm::streaming::StreamClient& stream, const std::string& method, const Json::Value& params)
{
	if (method == hbm::streaming::META_METHOD_AVAILABLE) {
		std::cout << "The following signal(s) are available : ";
		// simply subscibe all signals that become available.
		hbm::streaming::signalReferences_t signalReferences;
		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			std::cout << element.asString() << ", ";
			signalReferences.push_back(element.asString());
		}
		std::cout << std::endl << std::endl;

		try {
			stream.subscribe(signalReferences);
			std::cout << "The following " << signalReferences.size() << " signal(s) were subscribed: ";
		} catch(const std::runtime_error& e) {
			std::cerr << "Error '" << e.what() << "' subscribing the following signal(s): ";
		}

		for(hbm::streaming::signalReferences_t::const_iterator iter=signalReferences.begin(); iter!=signalReferences.end(); ++iter) {
			std::cout << "'" << *iter << "' ";
		}
		std::cout << std::endl << std::endl;

	} else if(method==hbm::streaming::META_METHOD_UNAVAILABLE) {
		std::cout << "The following signal(s) are not available anyore: ";

		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			std::cout << element.asString() << ", ";
		}
		std::cout << std::endl << std::endl;

	} else if(method==hbm::streaming::META_METHOD_ALIVE) {
		// We do ignore this. We are using TCP keep alive in order to detect communication problems.
	} else if(method==hbm::streaming::META_METHOD_FILL) {
		if(params.empty()==false) {
			unsigned int fill = params[0u].asUInt();
			if(fill>25) {
				std::cout << stream.address() << ": ring buffer fill level is " << params[0u].asUInt() << "%" << std::endl;
			}
		}
	} else {
		std::cout << "Meta information: " << method << " " << Json::FastWriter().write(params) << std::endl;
	}
}